

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O0

void amrex::EB_average_down
               (MultiFab *S_fine,MultiFab *S_crse,MultiFab *vol_fine,MultiFab *vfrac_fine,int scomp,
               int ncomp,IntVect *ratio)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  BoxArray *in_RSI;
  FabArrayBase *in_RDI;
  int in_R8D;
  int in_R9D;
  FabArray<amrex::FArrayBox> *in_stack_00000008;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Array4<const_double> *vfrac;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *vol;
  Array4<const_double> *fine_arr;
  Array4<double> *crse_arr;
  Box result;
  FabType typ;
  EBCellFlagFab *flag_fab;
  FArrayBox *fine_fab;
  FArrayBox *crse_fab;
  Box *tbx;
  MFIter mfi;
  Dim3 dratio;
  MultiFab crse_S_fine;
  BoxArray crse_S_fine_BA;
  DistributionMapping *fine_dm;
  int iref;
  int jref;
  int kref;
  Real cv;
  Real cd;
  int kk;
  int jj;
  int ii;
  int facz;
  int facy;
  int facx;
  Real tmp;
  int ii_1;
  int jj_1;
  int kk_1;
  Real cv_1;
  Real c;
  int n_1;
  IntVect shft;
  BoxArray *in_stack_fffffffffffff338;
  MFIter *mfi_00;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff340;
  undefined4 in_stack_fffffffffffff348;
  undefined4 in_stack_fffffffffffff34c;
  Periodicity *in_stack_fffffffffffff350;
  Array4<double> *in_stack_fffffffffffff358;
  int iVar4;
  EBCellFlagFab *in_stack_fffffffffffff360;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff368;
  FabArray<amrex::FArrayBox> *pFVar5;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff370;
  undefined7 in_stack_fffffffffffff378;
  undefined1 in_stack_fffffffffffff37f;
  CpOp op;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffff380;
  BoxArray *in_stack_fffffffffffff388;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff390;
  MFIter *this;
  int local_c3c;
  int local_c38;
  BATType local_c34;
  Periodicity local_bf0 [5];
  Periodicity *local_bb0;
  int local_ba8;
  int local_ba4;
  BATType in_stack_fffffffffffff460;
  BATType BVar6;
  int in_stack_fffffffffffff464;
  EBCellFlagFab *in_stack_fffffffffffff468;
  long local_b58;
  long local_b50;
  long local_b48;
  int local_b38;
  int local_b34;
  int local_b30;
  long *local_b18;
  Array4<const_double> local_b10;
  Array4<const_double> *local_ad0;
  Array4<double> local_ac8;
  Array4<double> *local_a88;
  undefined1 local_a80 [88];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a28;
  MFIter local_a20;
  FabArrayBase *local_9c0;
  int local_9b8;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_9b0;
  int local_9a8;
  undefined1 local_9a0 [24];
  DataAllocator local_988;
  undefined8 uStack_980;
  pointer local_978;
  MFIter *local_778;
  int local_770;
  int local_76c;
  BoxArray *local_758;
  FabArrayBase *local_750;
  _func_int **local_748;
  BATType local_740;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_738;
  int local_72c;
  int iStack_728;
  BATType local_724;
  _func_int **local_720;
  BATType local_718;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_710;
  int local_704;
  int iStack_700;
  BATType local_6fc;
  undefined8 local_6f8;
  int local_6f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6e8;
  uint local_6dc;
  int iStack_6d8;
  int local_6d4;
  EBCellFlagFab *local_6d0;
  int local_6c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6c0;
  uint local_6b4;
  int iStack_6b0;
  int local_6ac;
  FabArrayBase *local_6a8;
  int local_6a0;
  FabArray<amrex::FArrayBox> *local_698;
  undefined4 local_68c;
  undefined4 uStack_688;
  int local_684;
  FabArray<amrex::FArrayBox> *local_680;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_678;
  FArrayBox *local_670;
  FArrayBox *local_668;
  int local_65c;
  int local_658;
  int local_654;
  double local_650;
  double local_648;
  int local_640;
  int local_63c;
  int local_638;
  int local_634;
  int local_630;
  int local_62c;
  undefined4 local_61c;
  long *local_618;
  Array4<const_double> *local_610;
  Array4<double> *local_608;
  int local_600;
  BATType local_5fc;
  int local_5f8;
  int local_5f4;
  int local_5f0;
  BATType local_5ec;
  int local_5e8;
  int local_5e4;
  Array4<double> *local_5e0;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  long *local_5c8;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  long *local_5b0;
  double local_5a8;
  int local_59c;
  int local_598;
  int local_594;
  double local_590;
  double local_588;
  int local_580;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> *local_578;
  Periodicity *local_570;
  long *local_568;
  undefined4 local_55c;
  Array4<double> *local_558;
  Array4<const_double> *local_548;
  BATType local_53c;
  int local_538;
  int local_534;
  int local_530;
  BATType local_52c;
  int local_528;
  int local_524;
  Array4<double> *local_520;
  int local_518;
  BATType local_514;
  int local_510;
  int local_50c;
  Array4<double> *local_508;
  int local_4fc;
  int local_4f8;
  int local_4f4;
  Periodicity *local_4f0;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  long *local_4d8;
  char *local_4d0;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  Array4<const_double> *local_4b8;
  int local_4b0;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  Array4<const_double> *local_4a0;
  int local_498;
  int local_494;
  int local_490;
  int local_48c;
  Array4<const_double> *local_488;
  undefined4 local_47c;
  undefined4 local_46c;
  undefined4 local_45c;
  undefined4 local_44c;
  BATOp *local_448;
  undefined4 local_43c;
  BATOp *local_438;
  undefined4 local_42c;
  BATOp *local_428;
  undefined4 local_41c;
  BATOp *local_418;
  undefined4 local_40c;
  BATOp *local_408;
  undefined4 local_3fc;
  BATOp *local_3f8;
  undefined4 local_3ec;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3e8;
  undefined4 local_3dc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3d8;
  undefined4 local_3cc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3c8;
  undefined4 local_3bc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3b8;
  undefined4 local_3ac;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3a8;
  undefined4 local_39c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_398;
  int local_390 [2];
  int local_388;
  int local_380;
  int iStack_37c;
  int local_378;
  IntVect local_374;
  FabArray<amrex::FArrayBox> *local_368;
  FabArray<amrex::FArrayBox> *local_360;
  undefined4 local_354;
  FabArray<amrex::FArrayBox> *local_350;
  int local_348 [2];
  int local_340;
  int *local_338;
  IntVect local_32c;
  IntVect *local_320;
  BATOp *local_318;
  undefined4 local_30c;
  IntVect *local_308;
  undefined4 local_2fc;
  IntVect *local_2f8;
  undefined4 local_2ec;
  IntVect *local_2e8;
  int *local_2e0;
  IntVect *local_2d8;
  undefined4 local_2cc;
  int *local_2c8;
  undefined4 local_2bc;
  int *local_2b8;
  undefined4 local_2ac;
  int *local_2a8;
  FabArray<amrex::FArrayBox> *local_2a0;
  BATOp *local_298;
  undefined4 local_28c;
  FabArray<amrex::FArrayBox> *local_288;
  undefined4 local_27c;
  FabArray<amrex::FArrayBox> *local_278;
  undefined4 local_26c;
  FabArray<amrex::FArrayBox> *local_268;
  FabArray<amrex::FArrayBox> *local_260;
  FabArray<amrex::FArrayBox> *local_258;
  undefined4 local_24c;
  FabArray<amrex::FArrayBox> *local_248;
  undefined4 local_23c;
  FabArray<amrex::FArrayBox> *local_238;
  undefined4 local_22c;
  FabArray<amrex::FArrayBox> *local_228;
  IntVect *local_220;
  BATOp *local_218;
  undefined4 local_20c;
  IntVect *local_208;
  undefined4 local_1fc;
  IntVect *local_1f8;
  undefined4 local_1ec;
  IntVect *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  double *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_770 = in_R9D;
  local_76c = in_R8D;
  local_758 = in_RSI;
  local_750 = in_RDI;
  local_778 = (MFIter *)FabArrayBase::DistributionMap(in_RDI);
  FabArrayBase::boxArray(local_750);
  BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff340,in_stack_fffffffffffff338);
  BoxArray::coarsen(in_stack_fffffffffffff388,(IntVect *)in_stack_fffffffffffff380);
  local_988.m_arena = (Arena *)0x0;
  uStack_980._0_4_ = 0;
  uStack_980._4_4_ = 0;
  local_9a0._8_8_ = (FabArrayBase *)0x0;
  local_9a0._16_8_ =
       (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
        )0x0;
  local_978 = (pointer)0x0;
  this = local_778;
  MFInfo::MFInfo((MFInfo *)0x13e3ee9);
  local_9a0._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  mfi_00 = (MFIter *)local_9a0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff340);
  MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffff380,
                     (BoxArray *)CONCAT17(in_stack_fffffffffffff37f,in_stack_fffffffffffff378),
                     (DistributionMapping *)in_stack_fffffffffffff370,
                     (int)((ulong)in_stack_fffffffffffff368 >> 0x20),(int)in_stack_fffffffffffff368,
                     (MFInfo *)in_stack_fffffffffffff360,in_stack_fffffffffffff390);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x13e3f47);
  MFInfo::~MFInfo((MFInfo *)0x13e3f54);
  local_698 = in_stack_00000008;
  local_68c = *(undefined4 *)
               &(((__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                   *)&(in_stack_00000008->super_FabArrayBase)._vptr_FabArrayBase)->
                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                )._M_t.
                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
  uStack_688 = *(undefined4 *)
                ((long)&(((__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                           *)&(in_stack_00000008->super_FabArrayBase)._vptr_FabArrayBase)->
                        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                        )._M_t.
                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 4);
  local_9c0 = (((__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                 *)&(in_stack_00000008->super_FabArrayBase)._vptr_FabArrayBase)->
              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
              ._M_t.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
  local_9b8 = (in_stack_00000008->super_FabArrayBase).boxarray.m_bat.m_bat_type;
  local_9b0._M_head_impl = local_9c0;
  local_9a8 = local_9b8;
  local_6a8 = local_9c0;
  local_6a0 = local_9b8;
  local_684 = local_9b8;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)in_stack_fffffffffffff370,&in_stack_fffffffffffff368->super_FabArrayBase,
                 SUB81((ulong)in_stack_fffffffffffff360 >> 0x38,0));
  while( true ) {
    op = (CpOp)in_stack_fffffffffffff380;
    iVar4 = (int)((ulong)in_stack_fffffffffffff358 >> 0x20);
    bVar3 = MFIter::isValid(&local_a20);
    if (!bVar3) break;
    in_stack_fffffffffffff380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a80 + 0x3c);
    MFIter::tilebox(this);
    local_a28._M_pi = in_stack_fffffffffffff380;
    local_a80._48_8_ = FabArray<amrex::FArrayBox>::operator[](in_stack_fffffffffffff340,mfi_00);
    local_a80._40_8_ = FabArray<amrex::FArrayBox>::operator[](in_stack_fffffffffffff340,mfi_00);
    in_stack_fffffffffffff360 = getEBCellFlagFab((FArrayBox *)in_stack_fffffffffffff340);
    local_678 = local_a28._M_pi;
    local_680 = in_stack_00000008;
    local_a80._0_8_ =
         (((FabArray<amrex::FArrayBox> *)&(local_a28._M_pi)->_vptr__Sp_counted_base)->
         super_FabArrayBase)._vptr_FabArrayBase;
    local_a80._8_8_ = *(undefined8 *)&((BoxArray *)&(local_a28._M_pi)->_M_use_count)->m_bat;
    local_a80._16_8_ = local_a28._M_pi[1]._vptr__Sp_counted_base;
    local_a80._24_4_ = local_a28._M_pi[1]._M_use_count;
    in_stack_fffffffffffff368 = (FabArray<amrex::FArrayBox> *)local_a80;
    local_368 = in_stack_00000008;
    local_350 = in_stack_00000008;
    local_354 = 1;
    bVar3 = true;
    if ((*(int *)&(((__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                     *)&(in_stack_00000008->super_FabArrayBase)._vptr_FabArrayBase)->
                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                  )._M_t.
                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl == 1) &&
       (bVar3 = true,
       *(int *)((long)&(((__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                          *)&(in_stack_00000008->super_FabArrayBase)._vptr_FabArrayBase)->
                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                       )._M_t.
                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 4) == 1))
    {
      bVar3 = (in_stack_00000008->super_FabArrayBase).boxarray.m_bat.m_bat_type != 1;
    }
    in_stack_fffffffffffff370 = in_stack_00000008;
    local_a80._32_8_ = in_stack_fffffffffffff360;
    local_360 = in_stack_fffffffffffff368;
    if (bVar3) {
      IntVect::IntVect(&local_374,1);
      local_338 = (in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                  m_crse_ratio.vect + 1;
      uVar1 = *local_338;
      IntVect::IntVect(&local_32c,uVar1 & 1,uVar1 >> 1 & 1,uVar1 >> 2 & 1);
      local_340 = local_32c.vect[2];
      local_348[0] = local_32c.vect[0];
      local_348[1] = local_32c.vect[1];
      local_388 = local_32c.vect[2];
      local_390[0] = local_32c.vect[0];
      local_390[1] = local_32c.vect[1];
      local_380 = local_32c.vect[0];
      iStack_37c = local_32c.vect[1];
      uVar2 = _local_380;
      local_378 = local_32c.vect[2];
      local_2d8 = &local_374;
      local_2e0 = &local_380;
      local_2ac = 0;
      local_380 = local_32c.vect[0];
      local_374.vect[0] = local_374.vect[0] - local_380;
      local_2bc = 1;
      iStack_37c = local_32c.vect[1];
      local_374.vect[1] = local_374.vect[1] - iStack_37c;
      local_2cc = 2;
      local_374.vect[2] = local_374.vect[2] - local_32c.vect[2];
      local_260 = local_368;
      local_228 = local_368;
      local_22c = 0;
      pFVar5 = in_stack_fffffffffffff368;
      _local_380 = uVar2;
      local_2c8 = local_2e0;
      local_2b8 = local_2e0;
      local_2a8 = local_2e0;
      local_258 = in_stack_fffffffffffff368;
      *(int *)&(in_stack_fffffffffffff368->super_FabArrayBase)._vptr_FabArrayBase =
           *(int *)&(((__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                       *)&(local_368->super_FabArrayBase)._vptr_FabArrayBase)->
                    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl *
           *(int *)&(in_stack_fffffffffffff368->super_FabArrayBase)._vptr_FabArrayBase;
      local_238 = local_260;
      local_23c = 1;
      *(int *)((long)&(in_stack_fffffffffffff368->super_FabArrayBase)._vptr_FabArrayBase + 4) =
           *(int *)((long)&(((__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                              *)&(local_260->super_FabArrayBase)._vptr_FabArrayBase)->
                           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                           )._M_t.
                           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                           .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 4) *
           *(int *)((long)&(in_stack_fffffffffffff368->super_FabArrayBase)._vptr_FabArrayBase + 4);
      local_248 = local_260;
      local_24c = 2;
      (in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_bat_type =
           (local_260->super_FabArrayBase).boxarray.m_bat.m_bat_type *
           (in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_bat_type;
      local_218 = &(in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op;
      local_220 = &local_374;
      local_1ec = 0;
      local_1e8 = local_220;
      (local_218->m_indexType).m_typ.itype =
           local_374.vect[0] + (local_218->m_indexType).m_typ.itype;
      local_1f8 = local_220;
      local_1fc = 1;
      (in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
           local_220->vect[1] +
           (in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_typ.
           itype;
      local_208 = local_220;
      local_20c = 2;
      (in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
      vect[0] = local_220->vect[2] +
                (in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                m_crse_ratio.vect[0];
      local_298 = &(in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op;
      local_2a0 = local_368;
      local_268 = local_368;
      local_26c = 0;
      *(int *)local_298 =
           *(int *)&(((__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                       *)&(local_368->super_FabArrayBase)._vptr_FabArrayBase)->
                    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl *
           *(int *)local_298;
      local_278 = local_2a0;
      local_27c = 1;
      *(int *)((long)&(in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op + 4) =
           *(int *)((long)&(((__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                              *)&(local_2a0->super_FabArrayBase)._vptr_FabArrayBase)->
                           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                           )._M_t.
                           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                           .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 4) *
           *(int *)((long)&(in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op + 4);
      local_288 = local_2a0;
      local_28c = 2;
      (in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
      vect[0] = (local_2a0->super_FabArrayBase).boxarray.m_bat.m_bat_type *
                (in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                m_crse_ratio.vect[0];
      local_318 = &(in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op;
      local_320 = &local_374;
      local_2ec = 0;
      local_2e8 = local_320;
      (local_318->m_indexType).m_typ.itype =
           (local_318->m_indexType).m_typ.itype - local_374.vect[0];
      local_2f8 = local_320;
      local_2fc = 1;
      (in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
           (in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_typ.
           itype - local_320->vect[1];
      local_308 = local_320;
      local_30c = 2;
      (in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
      vect[0] = (in_stack_fffffffffffff368->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                m_crse_ratio.vect[0] - local_320->vect[2];
      in_stack_fffffffffffff368 = pFVar5;
    }
    local_a80._28_4_ =
         EBCellFlagFab::getType
                   (in_stack_fffffffffffff468,
                    (Box *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460));
    local_670 = (FArrayBox *)local_a80._48_8_;
    local_198 = *(double **)(local_a80._48_8_ + 0x10);
    local_1a0 = (Box *)(local_a80._48_8_ + 0x18);
    local_1a4 = *(int *)(local_a80._48_8_ + 0x34);
    local_14c = 0;
    local_178 = (local_1a0->smallend).vect[0];
    local_15c = 1;
    iStack_174 = *(int *)(local_a80._48_8_ + 0x1c);
    local_1c0.x = (local_1a0->smallend).vect[0];
    local_1c0.y = (local_1a0->smallend).vect[1];
    local_16c = 2;
    local_1c0.z = *(int *)(local_a80._48_8_ + 0x20);
    local_f8 = (IntVect *)(local_a80._48_8_ + 0x24);
    local_fc = 0;
    local_128 = local_f8->vect[0] + 1;
    local_108 = (IntVect *)(local_a80._48_8_ + 0x24);
    local_10c = 1;
    iStack_124 = *(int *)(local_a80._48_8_ + 0x28) + 1;
    local_118 = (IntVect *)(local_a80._48_8_ + 0x24);
    local_11c = 2;
    local_1e0.z = *(int *)(local_a80._48_8_ + 0x2c) + 1;
    local_1e0.y = iStack_124;
    local_1e0.x = local_128;
    in_stack_fffffffffffff358 = &local_ac8;
    local_1d0._0_8_ = local_1e0._0_8_;
    local_1d0.z = local_1e0.z;
    local_1b0._0_8_ = local_1c0._0_8_;
    local_1b0.z = local_1c0.z;
    local_190._0_8_ = local_1c0._0_8_;
    local_190.z = local_1c0.z;
    local_180 = local_1a0;
    local_170 = local_1c0.z;
    local_168 = local_1a0;
    local_158 = local_1a0;
    local_148 = local_1a0;
    local_140._0_8_ = local_1e0._0_8_;
    local_140.z = local_1e0.z;
    local_130 = local_1a0;
    local_120 = local_1e0.z;
    Array4<double>::Array4(in_stack_fffffffffffff358,local_198,&local_1b0,&local_1d0,local_1a4);
    local_668 = (FArrayBox *)local_a80._40_8_;
    local_a8 = *(double **)(local_a80._40_8_ + 0x10);
    local_b0 = (Box *)(local_a80._40_8_ + 0x18);
    local_b4 = *(int *)(local_a80._40_8_ + 0x34);
    local_5c = 0;
    local_88 = (local_b0->smallend).vect[0];
    local_6c = 1;
    iStack_84 = *(int *)(local_a80._40_8_ + 0x1c);
    local_d0.x = (local_b0->smallend).vect[0];
    local_d0.y = (local_b0->smallend).vect[1];
    local_7c = 2;
    local_d0.z = *(int *)(local_a80._40_8_ + 0x20);
    local_8 = (IntVect *)(local_a80._40_8_ + 0x24);
    local_c = 0;
    local_38 = local_8->vect[0] + 1;
    local_18 = (IntVect *)(local_a80._40_8_ + 0x24);
    local_1c = 1;
    iStack_34 = *(int *)(local_a80._40_8_ + 0x28) + 1;
    local_28 = (IntVect *)(local_a80._40_8_ + 0x24);
    local_2c = 2;
    local_f0.z = *(int *)(local_a80._40_8_ + 0x2c) + 1;
    local_f0.y = iStack_34;
    local_f0.x = local_38;
    local_a88 = in_stack_fffffffffffff358;
    local_dc._0_8_ = local_f0._0_8_;
    local_dc.z = local_f0.z;
    local_c0._0_8_ = local_d0._0_8_;
    local_c0.z = local_d0.z;
    local_a0._0_8_ = local_d0._0_8_;
    local_a0.z = local_d0.z;
    local_90 = local_b0;
    local_80 = local_d0.z;
    local_78 = local_b0;
    local_68 = local_b0;
    local_58 = local_b0;
    local_50._0_8_ = local_f0._0_8_;
    local_50.z = local_f0.z;
    local_40 = local_b0;
    local_30 = local_f0.z;
    Array4<const_double>::Array4(&local_b10,local_a8,&local_c0,&local_dc,local_b4);
    local_ad0 = &local_b10;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff34c,in_stack_fffffffffffff348),
               (MFIter *)in_stack_fffffffffffff340);
    local_b18 = &local_b58;
    if ((local_a80._28_4_ == regular) || (local_a80._28_4_ == covered)) {
      local_710 = local_a28._M_pi;
      local_3c8 = local_a28._M_pi;
      local_3cc = 0;
      local_704 = *(int *)&(((FabArray<amrex::FArrayBox> *)
                            &(local_a28._M_pi)->_vptr__Sp_counted_base)->super_FabArrayBase).
                           _vptr_FabArrayBase;
      local_3d8 = local_a28._M_pi;
      local_3dc = 1;
      iStack_700 = *(int *)((long)&(((FabArray<amrex::FArrayBox> *)
                                    &(local_a28._M_pi)->_vptr__Sp_counted_base)->super_FabArrayBase)
                                   ._vptr_FabArrayBase + 4);
      local_720 = (((FabArray<amrex::FArrayBox> *)&(local_a28._M_pi)->_vptr__Sp_counted_base)->
                  super_FabArrayBase)._vptr_FabArrayBase;
      local_3e8 = local_a28._M_pi;
      local_3ec = 2;
      local_718 = (((BoxArray *)&(local_a28._M_pi)->_M_use_count)->m_bat).m_bat_type;
      local_6c0 = local_a28._M_pi;
      local_428 = (BATOp *)&(local_a28._M_pi)->_M_weak_count;
      local_42c = 0;
      local_6b4 = (local_428->m_indexType).m_typ.itype;
      local_438 = (BATOp *)&(local_a28._M_pi)->_M_weak_count;
      local_43c = 1;
      iStack_6b0 = *(int *)&local_a28._M_pi[1]._vptr__Sp_counted_base;
      in_stack_fffffffffffff468 = *(EBCellFlagFab **)local_428;
      local_448 = (BATOp *)&(local_a28._M_pi)->_M_weak_count;
      local_44c = 2;
      local_6c8 = *(int *)((long)&local_a28._M_pi[1]._vptr__Sp_counted_base + 4);
      for (in_stack_fffffffffffff464 = 0; BVar6 = local_718, local_6fc = local_718,
          local_6d0 = in_stack_fffffffffffff468, local_6ac = local_6c8,
          in_stack_fffffffffffff464 < local_770;
          in_stack_fffffffffffff464 = in_stack_fffffffffffff464 + 1) {
        for (; iVar4 = iStack_700, (int)BVar6 <= local_6c8; BVar6 = BVar6 + indexType) {
          while (local_ba4 = iVar4, iVar4 = local_704, local_ba4 <= iStack_6b0) {
            while (local_ba8 = iVar4, local_ba8 <= (int)local_6b4) {
              local_5f4 = local_ba8;
              local_5f8 = local_ba4;
              local_608 = local_a88;
              local_610 = local_ad0;
              local_61c = 0;
              local_45c = 0;
              local_62c = *(int *)&(((__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                                      *)&(in_stack_00000008->super_FabArrayBase)._vptr_FabArrayBase)
                                   ->
                                   super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                   )._M_t.
                                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
              ;
              local_46c = 1;
              local_630 = *(int *)((long)&(((__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                                             *)&(in_stack_00000008->super_FabArrayBase).
                                                _vptr_FabArrayBase)->
                                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                          )._M_t.
                                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                          _M_head_impl + 4);
              local_47c = 2;
              local_634 = (in_stack_00000008->super_FabArrayBase).boxarray.m_bat.m_bat_type;
              local_638 = local_ba8 * local_62c;
              local_63c = local_ba4 * local_630;
              local_640 = BVar6 * local_634;
              local_648 = 0.0;
              local_650 = 0.0;
              for (local_654 = 0; local_654 < local_634; local_654 = local_654 + 1) {
                for (local_658 = 0; local_658 < local_630; local_658 = local_658 + 1) {
                  for (local_65c = 0; local_65c < local_62c; local_65c = local_65c + 1) {
                    local_5b4 = local_638 + local_65c;
                    local_5b8 = local_63c + local_658;
                    local_5bc = local_640 + local_654;
                    local_650 = *(double *)
                                 (local_b58 +
                                 ((long)(local_5b4 - local_b38) +
                                  (local_5b8 - local_b34) * local_b50 +
                                 (local_5bc - local_b30) * local_b48) * 8) + local_650;
                    local_488 = local_ad0;
                    local_48c = local_638 + local_65c;
                    local_490 = local_63c + local_658;
                    local_494 = local_640 + local_654;
                    local_498 = in_stack_fffffffffffff464 + local_76c;
                    local_5cc = local_638 + local_65c;
                    local_5d0 = local_63c + local_658;
                    local_5d4 = local_640 + local_654;
                    local_648 = local_ad0->p
                                [(long)(local_48c - (local_ad0->begin).x) +
                                 (long)(local_490 - (local_ad0->begin).y) * local_ad0->jstride +
                                 (long)(local_494 - (local_ad0->begin).z) * local_ad0->kstride +
                                 (long)local_498 * local_ad0->nstride] *
                                *(double *)
                                 (local_b58 +
                                 ((long)(local_5cc - local_b38) +
                                  (local_5d0 - local_b34) * local_b50 +
                                 (local_5d4 - local_b30) * local_b48) * 8) + local_648;
                    local_5c8 = local_b18;
                    local_5b0 = local_b18;
                  }
                }
              }
              local_5e0 = local_a88;
              local_5e4 = local_ba8;
              local_5e8 = local_ba4;
              local_a88->p
              [(long)(local_ba8 - (local_a88->begin).x) +
               (long)(local_ba4 - (local_a88->begin).y) * local_a88->jstride +
               (long)(int)(BVar6 - (local_a88->begin).z) * local_a88->kstride +
               (long)in_stack_fffffffffffff464 * local_a88->nstride] = local_648 / local_650;
              local_618 = local_b18;
              local_600 = in_stack_fffffffffffff464;
              local_5fc = BVar6;
              local_5f0 = in_stack_fffffffffffff464;
              local_5ec = BVar6;
              iVar4 = local_ba8 + 1;
            }
            iVar4 = local_ba4 + 1;
          }
        }
        in_stack_fffffffffffff460 = BVar6;
      }
    }
    else if (local_a80._28_4_ == singlevalued) {
      in_stack_fffffffffffff350 = local_bf0;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff34c,in_stack_fffffffffffff348),
                 (MFIter *)in_stack_fffffffffffff340);
      local_738 = local_a28._M_pi;
      local_398 = local_a28._M_pi;
      local_39c = 0;
      local_72c = *(int *)&(((FabArray<amrex::FArrayBox> *)
                            &(local_a28._M_pi)->_vptr__Sp_counted_base)->super_FabArrayBase).
                           _vptr_FabArrayBase;
      local_3a8 = local_a28._M_pi;
      local_3ac = 1;
      iStack_728 = *(int *)((long)&(((FabArray<amrex::FArrayBox> *)
                                    &(local_a28._M_pi)->_vptr__Sp_counted_base)->super_FabArrayBase)
                                   ._vptr_FabArrayBase + 4);
      local_748 = (((FabArray<amrex::FArrayBox> *)&(local_a28._M_pi)->_vptr__Sp_counted_base)->
                  super_FabArrayBase)._vptr_FabArrayBase;
      local_3b8 = local_a28._M_pi;
      local_3bc = 2;
      local_740 = (((BoxArray *)&(local_a28._M_pi)->_M_use_count)->m_bat).m_bat_type;
      local_6e8 = local_a28._M_pi;
      local_3f8 = (BATOp *)&(local_a28._M_pi)->_M_weak_count;
      local_3fc = 0;
      local_6dc = (local_3f8->m_indexType).m_typ.itype;
      local_408 = (BATOp *)&(local_a28._M_pi)->_M_weak_count;
      local_40c = 1;
      iStack_6d8 = *(int *)&local_a28._M_pi[1]._vptr__Sp_counted_base;
      local_6f8 = *(undefined8 *)local_3f8;
      local_418 = (BATOp *)&(local_a28._M_pi)->_M_weak_count;
      local_41c = 2;
      local_6f0 = *(int *)((long)&local_a28._M_pi[1]._vptr__Sp_counted_base + 4);
      for (local_c34 = local_740; local_c38 = iStack_728, local_bb0 = in_stack_fffffffffffff350,
          local_724 = local_740, local_6d4 = local_6f0, (int)local_c34 <= local_6f0;
          local_c34 = local_c34 + indexType) {
        for (; local_c3c = local_72c, local_c38 <= iStack_6d8; local_c38 = local_c38 + 1) {
          for (; local_c3c <= (int)local_6dc; local_c3c = local_c3c + 1) {
            local_534 = local_c3c;
            local_538 = local_c38;
            local_53c = local_c34;
            local_548 = local_ad0;
            local_558 = local_a88;
            local_568 = local_b18;
            local_55c = 0;
            local_578 = &local_9b0;
            for (local_580 = 0; local_580 < local_770; local_580 = local_580 + 1) {
              local_588 = 0.0;
              local_590 = 0.0;
              local_594 = local_c34 * local_9a8;
              while( true ) {
                if ((int)((local_c34 + indexType) * local_9a8) <= local_594) break;
                for (local_598 = local_c38 * local_9b0._M_head_impl._4_4_;
                    local_598 < (local_c38 + 1) * local_9b0._M_head_impl._4_4_;
                    local_598 = local_598 + 1) {
                  for (local_59c = local_c3c * (int)local_9b0._M_head_impl;
                      local_59c < (local_c3c + 1) * (int)local_9b0._M_head_impl;
                      local_59c = local_59c + 1) {
                    local_4d8 = local_b18;
                    local_4dc = local_59c;
                    local_4e0 = local_598;
                    local_4e4 = local_594;
                    local_4f4 = local_59c;
                    local_4f8 = local_598;
                    local_4fc = local_594;
                    local_5a8 = *(double *)
                                 (*local_b18 +
                                 ((long)(local_59c - (int)local_b18[4]) +
                                  (long)(local_598 - *(int *)((long)local_b18 + 0x24)) *
                                  local_b18[1] +
                                 (long)(local_594 - (int)local_b18[5]) * local_b18[2]) * 8) *
                                *(double *)
                                 (*(long *)(in_stack_fffffffffffff350->period).vect +
                                 ((long)(local_59c - in_stack_fffffffffffff350[2].period.vect[2]) +
                                  (long)(local_598 - in_stack_fffffffffffff350[3].period.vect[0]) *
                                  *(long *)((in_stack_fffffffffffff350->period).vect + 2) +
                                 (long)(local_594 - in_stack_fffffffffffff350[3].period.vect[1]) *
                                 *(long *)(in_stack_fffffffffffff350[1].period.vect + 1)) * 8);
                    local_4b8 = local_ad0;
                    local_4bc = local_59c;
                    local_4c0 = local_598;
                    local_4c4 = local_594;
                    local_4c8 = local_580 + local_76c;
                    local_588 = local_ad0->p
                                [(long)(local_59c - (local_ad0->begin).x) +
                                 (long)(local_598 - (local_ad0->begin).y) * local_ad0->jstride +
                                 (long)(local_594 - (local_ad0->begin).z) * local_ad0->kstride +
                                 (long)local_4c8 * local_ad0->nstride] * local_5a8 + local_588;
                    local_590 = local_5a8 + local_590;
                    local_4f0 = in_stack_fffffffffffff350;
                  }
                }
                local_594 = local_594 + 1;
              }
              if (local_590 <= 1e-30) {
                local_4a4 = local_c3c * (int)local_9b0._M_head_impl;
                local_4a8 = local_c38 * local_9b0._M_head_impl._4_4_;
                local_4ac = local_c34 * local_9a8;
                local_4b0 = local_580 + local_76c;
                local_4a0 = local_ad0;
                local_530 = local_580;
                local_520 = local_a88;
                local_524 = local_c3c;
                local_528 = local_c38;
                local_52c = local_c34;
                local_a88->p
                [(long)(local_c3c - (local_a88->begin).x) +
                 (long)(local_c38 - (local_a88->begin).y) * local_a88->jstride +
                 (long)(int)(local_c34 - (local_a88->begin).z) * local_a88->kstride +
                 (long)local_580 * local_a88->nstride] =
                     local_ad0->p
                     [(long)(local_4a4 - (local_ad0->begin).x) +
                      (long)(local_4a8 - (local_ad0->begin).y) * local_ad0->jstride +
                      (long)(local_4ac - (local_ad0->begin).z) * local_ad0->kstride +
                      (long)local_4b0 * local_ad0->nstride];
              }
              else {
                local_518 = local_580;
                local_508 = local_a88;
                local_50c = local_c3c;
                local_510 = local_c38;
                local_514 = local_c34;
                local_a88->p
                [(long)(local_c3c - (local_a88->begin).x) +
                 (long)(local_c38 - (local_a88->begin).y) * local_a88->jstride +
                 (long)(int)(local_c34 - (local_a88->begin).z) * local_a88->kstride +
                 (long)local_580 * local_a88->nstride] = local_588 / local_590;
              }
            }
            local_570 = in_stack_fffffffffffff350;
          }
        }
      }
    }
    else {
      local_4d0 = "multi-valued avgdown to be implemented";
      Abort_host((char *)in_stack_fffffffffffff350);
    }
    MFIter::operator++(&local_a20);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffff340);
  Periodicity::NonPeriodic();
  FabArray<amrex::FArrayBox>::ParallelCopy
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,
             (int)((ulong)in_stack_fffffffffffff360 >> 0x20),(int)in_stack_fffffffffffff360,iVar4,
             in_stack_fffffffffffff350,op);
  MultiFab::~MultiFab((MultiFab *)0x13e5e18);
  BoxArray::~BoxArray(local_758);
  return;
}

Assistant:

void
EB_average_down (const MultiFab& S_fine, MultiFab& S_crse, const MultiFab& vol_fine,
                 const MultiFab& vfrac_fine, int scomp, int ncomp, const IntVect& ratio)
{
    BL_PROFILE("EB_average_down");

    AMREX_ASSERT(S_fine.ixType().cellCentered());
    AMREX_ASSERT(S_crse.ixType().cellCentered());

    const DistributionMapping& fine_dm = S_fine.DistributionMap();
    BoxArray crse_S_fine_BA = S_fine.boxArray();
    crse_S_fine_BA.coarsen(ratio);

    MultiFab crse_S_fine(crse_S_fine_BA,fine_dm,ncomp,0,MFInfo(),FArrayBoxFactory());

    Dim3 dratio = ratio.dim3();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(crse_S_fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& tbx = mfi.tilebox();
        auto& crse_fab = crse_S_fine[mfi];
        const auto& fine_fab = S_fine[mfi];

        const auto& flag_fab = amrex::getEBCellFlagFab(fine_fab);
        FabType typ = flag_fab.getType(amrex::refine(tbx,ratio));

        Array4<Real> const& crse_arr = crse_fab.array();
        Array4<Real const> const& fine_arr = fine_fab.const_array();
        Array4<Real const> const& vol = vol_fine.const_array(mfi);

        if (typ == FabType::regular || typ == FabType::covered)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(tbx, ncomp, i, j, k, n,
            {
                amrex_avgdown_with_vol(i,j,k,n, crse_arr, fine_arr, vol, 0, scomp, ratio);
            });
        }
        else if (typ == FabType::singlevalued)
        {
            Array4<Real const> const& vfrac = vfrac_fine.const_array(mfi);
            AMREX_HOST_DEVICE_FOR_3D(tbx, i, j, k,
            {
                eb_avgdown_with_vol(i,j,k,fine_arr,scomp,crse_arr,0,vol,vfrac,dratio,ncomp);
            });
        }
        else
        {
            amrex::Abort("multi-valued avgdown to be implemented");
        }
    }

    S_crse.ParallelCopy(crse_S_fine,0,scomp,ncomp);
}